

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dis.h
# Opt level: O0

expr * makebinex(etype type,expr *expr1,expr *expr2)

{
  expr *peVar1;
  expr *in_RDX;
  expr *in_RSI;
  int in_EDI;
  expr *res;
  bool local_21;
  undefined8 in_stack_ffffffffffffffe0;
  
  peVar1 = makeex((etype)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  peVar1->expr1 = in_RSI;
  peVar1->expr2 = in_RDX;
  if ((in_EDI != 0x13) && (in_EDI != 0x14)) {
    local_21 = false;
    if (in_RSI->isimm != 0) {
      local_21 = in_RDX->isimm != 0;
    }
    peVar1->isimm = (uint)local_21;
  }
  return peVar1;
}

Assistant:

static inline struct expr *makebinex(enum etype type, const struct expr *expr1, const struct expr *expr2) {
	struct expr *res = makeex(type);
	res->expr1 = expr1;
	res->expr2 = expr2;
	if (type != EXPR_PIADD && type != EXPR_PISUB)
		res->isimm = expr1->isimm && expr2->isimm;
	return res;
}